

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::AnyLocsAreLive
          (EliminateDeadOutputStoresPass *this,uint32_t start,uint32_t count)

{
  iterator iVar1;
  uint local_1c;
  
  if (start < count + start) {
    local_1c = start;
    do {
      iVar1 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this->live_locs_->_M_h,&local_1c);
      if (iVar1.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        return true;
      }
      local_1c = local_1c + 1;
    } while (local_1c < count + start);
  }
  return false;
}

Assistant:

bool EliminateDeadOutputStoresPass::AnyLocsAreLive(uint32_t start,
                                                   uint32_t count) {
  auto finish = start + count;
  for (uint32_t u = start; u < finish; ++u) {
    if (live_locs_->find(u) != live_locs_->end()) return true;
  }
  return false;
}